

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPParser.cpp
# Opt level: O2

void __thiscall MADPParser::Parse(MADPParser *this,FactoredDecPOMDPDiscrete *model)

{
  ParserProbModelXML parser;
  ParserProbModelXML local_110;
  
  ParserProbModelXML::ParserProbModelXML(&local_110,model);
  ParserProbModelXML::Parse(&local_110);
  ParserProbModelXML::~ParserProbModelXML(&local_110);
  return;
}

Assistant:

void MADPParser::Parse(FactoredDecPOMDPDiscrete *model)
{
    ParserProbModelXML parser(model);
    parser.Parse();
}